

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>
               (bit_array *x,quadratic_cost_type<long_double> *c,int variables,int value_if_0)

{
  int iVar1;
  int *piVar2;
  longdouble *plVar3;
  quad *pqVar4;
  int iVar5;
  ulong uVar6;
  longdouble lVar7;
  
  if (variables != 0) {
    uVar6 = 0;
    do {
      piVar2 = (c->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      lVar7 = (c->linear_elements)._M_t.
              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
              super__Head_base<0UL,_long_double_*,_false>._M_head_impl[uVar6];
      iVar1 = piVar2[uVar6];
      iVar5 = piVar2[uVar6 + 1];
      if (iVar5 != iVar1) {
        iVar5 = iVar5 - iVar1;
        pqVar4 = (c->quadratic_elements)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                 ._M_head_impl + iVar1;
        do {
          plVar3 = &pqVar4->factor;
          pqVar4 = pqVar4 + 1;
          iVar5 = iVar5 + -1;
          lVar7 = *plVar3 + lVar7;
        } while (iVar5 != 0);
      }
      if (((longdouble)0 < lVar7) || (value_if_0 != 0 && lVar7 == (longdouble)0)) {
        bit_array_impl::set(&x->super_bit_array_impl,(int)uVar6);
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,(int)uVar6);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)variables);
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}